

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int __thiscall
CVmObjFile::getp_get_pos(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  long lVar2;
  vm_val_t *in_RDX;
  CVmObjFile *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((getp_get_pos(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_pos(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_pos::desc,0);
    __cxa_guard_release(&getp_get_pos(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,(uint *)in_RDI,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    check_valid_file(in_RDI);
    lVar2 = get_pos(in_RDI);
    vm_val_t::set_int(in_RDX,(int32_t)lVar2);
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_get_pos(VMG_ vm_obj_id_t self, vm_val_t *retval,
                             uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);

    /* get the position */
    retval->set_int(get_pos(vmg0_));

    /* handled */
    return TRUE;
}